

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

Ivy_FraigMan_t * Ivy_FraigStart(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Ivy_FraigMan_t *__s;
  Ivy_Man_t *pIVar5;
  char *pcVar6;
  Ivy_Obj_t *pObj_00;
  Ivy_FraigSim_t *pSim;
  Ivy_Obj_t *pIVar7;
  Ivy_FraigSim_t *pIVar8;
  uint *puVar9;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  int local_38;
  int EntrySize;
  int k;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_FraigSim_t *pSims;
  Ivy_FraigMan_t *p;
  Ivy_FraigParams_t *pParams_local;
  Ivy_Man_t *pManAig_local;
  
  for (EntrySize = 0; iVar1 = Vec_PtrSize(pManAig->vObjs), EntrySize < iVar1;
      EntrySize = EntrySize + 1) {
    pvVar4 = Vec_PtrEntry(pManAig->vObjs,EntrySize);
    if ((pvVar4 != (void *)0x0) &&
       ((*(long *)((long)pvVar4 + 0x48) != 0 || (*(long *)((long)pvVar4 + 0x20) != 0)))) {
      __assert_fail("!pObj->pEquiv && !pObj->pFanout",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x233,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
    }
  }
  __s = (Ivy_FraigMan_t *)malloc(0x138);
  memset(__s,0,0x138);
  __s->pParams = pParams;
  __s->pManAig = pManAig;
  pIVar5 = Ivy_ManStartFrom(pManAig);
  __s->pManFraig = pIVar5;
  __s->nSimWords = pParams->nSimWords;
  iVar1 = __s->nSimWords * 4 + 0x20;
  iVar2 = Ivy_ManObjNum(pManAig);
  pcVar6 = (char *)malloc((long)(iVar2 * iVar1));
  __s->pSimWords = pcVar6;
  memset(__s->pSimWords,0,(long)iVar1);
  local_38 = 0;
  for (EntrySize = 0; iVar2 = Vec_PtrSize(pManAig->vObjs), EntrySize < iVar2;
      EntrySize = EntrySize + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(pManAig->vObjs,EntrySize);
    if (pObj_00 != (Ivy_Obj_t *)0x0) {
      pSim = (Ivy_FraigSim_t *)(__s->pSimWords + iVar1 * local_38);
      pSim->pNext = (Ivy_FraigSim_t *)0x0;
      iVar2 = Ivy_ObjIsNode(pObj_00);
      if (iVar2 == 0) {
        pSim->pFanin0 = (Ivy_FraigSim_t *)0x0;
        pSim->pFanin1 = (Ivy_FraigSim_t *)0x0;
        pSim->Type = 0;
      }
      else {
        if (__s->pSimStart == (Ivy_FraigSim_t *)0x0) {
          __s->pSimStart = pSim;
        }
        else {
          *(Ivy_FraigSim_t **)(__s->pSimWords + (long)(iVar1 * (local_38 + -1)) + 8) = pSim;
        }
        pIVar7 = Ivy_ObjFanin0(pObj_00);
        pIVar8 = Ivy_ObjSim(pIVar7);
        pSim->pFanin0 = pIVar8;
        pIVar7 = Ivy_ObjFanin1(pObj_00);
        pIVar8 = Ivy_ObjSim(pIVar7);
        pSim->pFanin1 = pIVar8;
        pIVar7 = Ivy_ObjChild0(pObj_00);
        iVar2 = Ivy_ObjFaninPhase(pIVar7);
        pIVar7 = Ivy_ObjChild1(pObj_00);
        iVar3 = Ivy_ObjFaninPhase(pIVar7);
        pSim->Type = iVar2 << 2 | iVar3 << 1 | *(uint *)&pObj_00->field_0x8 >> 7 & 1;
      }
      Ivy_ObjSetSim(pObj_00,pSim);
      local_38 = local_38 + 1;
    }
  }
  iVar1 = Ivy_ManObjNum(pManAig);
  if (local_38 == iVar1) {
    iVar1 = Ivy_ManPiNum(pManAig);
    iVar1 = Ivy_BitWordNum(iVar1);
    __s->nPatWords = iVar1;
    puVar9 = (uint *)malloc((long)__s->nPatWords << 2);
    __s->pPatWords = puVar9;
    piVar10 = (int *)malloc((long)(__s->nSimWords << 5) << 2);
    __s->pPatScores = piVar10;
    pVVar11 = Vec_PtrAlloc(100);
    __s->vPiVars = pVVar11;
    srand(0xabcabc);
    return __s;
  }
  __assert_fail("k == Ivy_ManObjNum(pManAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,599,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_FraigMan_t * Ivy_FraigStart( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, k, EntrySize;
    // clean the fanout representation
    Ivy_ManForEachObj( pManAig, pObj, i )
//        pObj->pEquiv = pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
        assert( !pObj->pEquiv && !pObj->pFanout );
    // allocat the fraiging manager
    p = ABC_ALLOC( Ivy_FraigMan_t, 1 );
    memset( p, 0, sizeof(Ivy_FraigMan_t) );
    p->pParams   = pParams;
    p->pManAig   = pManAig;
    p->pManFraig = Ivy_ManStartFrom( pManAig );
    // allocate simulation info
    p->nSimWords    = pParams->nSimWords;
//    p->pSimWords    = ABC_ALLOC( unsigned, Ivy_ManObjNum(pManAig) * p->nSimWords ); 
    EntrySize    = sizeof(Ivy_FraigSim_t) + sizeof(unsigned) * p->nSimWords;
    p->pSimWords = (char *)ABC_ALLOC( char, Ivy_ManObjNum(pManAig) * EntrySize ); 
    memset( p->pSimWords, 0, (size_t)EntrySize );
    k = 0;
    Ivy_ManForEachObj( pManAig, pObj, i )
    {
        pSims = (Ivy_FraigSim_t *)(p->pSimWords + EntrySize * k++);
        pSims->pNext = NULL;
        if ( Ivy_ObjIsNode(pObj) )
        {
            if ( p->pSimStart == NULL )
                p->pSimStart = pSims;
            else
                ((Ivy_FraigSim_t *)(p->pSimWords + EntrySize * (k-2)))->pNext = pSims;
            pSims->pFanin0 = Ivy_ObjSim( Ivy_ObjFanin0(pObj) );
            pSims->pFanin1 = Ivy_ObjSim( Ivy_ObjFanin1(pObj) );
            pSims->Type = (Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) << 2) | (Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj)) << 1) | pObj->fPhase;
        }
        else
        {
            pSims->pFanin0 = NULL;
            pSims->pFanin1 = NULL;
            pSims->Type = 0;
        }
        Ivy_ObjSetSim( pObj, pSims );
    }
    assert( k == Ivy_ManObjNum(pManAig) );
    // allocate storage for sim pattern
    p->nPatWords  = Ivy_BitWordNum( Ivy_ManPiNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->pPatScores = ABC_ALLOC( int, 32 * p->nSimWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // set random number generator
    srand( 0xABCABC );
    return p;
}